

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

FastPattern * trieste::detail::FastPattern::match_pred(void)

{
  FastPattern *in_RDI;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_48);
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_78);
  FastPattern(in_RDI,(set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                      *)&local_48,
              (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
              &local_78,true);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_78);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_48);
  return in_RDI;
}

Assistant:

static FastPattern match_pred()
      {
        return FastPattern({}, {}, true);
      }